

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

arrayMoveList * __thiscall
game::generateLegalMoves(arrayMoveList *__return_storage_ptr__,game *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar5;
  move mVar4;
  move moveMade;
  long lVar6;
  game *pgVar7;
  U64 *pUVar8;
  byte bVar9;
  arrayMoveList moves;
  bitboards in_stack_fffffffffffffc68;
  arrayMoveList local_330;
  
  bVar9 = 0;
  generateSemilegalMoves(&local_330,this);
  memset(__return_storage_ptr__,0,0x304);
  __return_storage_ptr__->iteratorCount = -1;
  arrayMoveList::resetIterator(&local_330);
  bVar1 = arrayMoveList::next(&local_330);
  if (bVar1) {
    do {
      mVar4 = arrayMoveList::getMove(&local_330);
      moveMade = arrayMoveList::getMove(&local_330);
      makeMove(this,moveMade);
      bVar1 = isGameLegal(this);
      if (((uint3)mVar4 & 0xff0000) == 0x10000) {
        undoMove(this);
        bVar2 = this->blacksTurn;
        pgVar7 = this;
        pUVar8 = (U64 *)&stack0xfffffffffffffc68;
        for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pUVar8 = (pgVar7->boards).WP;
          pgVar7 = (game *)((long)pgVar7 + (ulong)bVar9 * -0x10 + 8);
          pUVar8 = pUVar8 + (ulong)bVar9 * -2 + 1;
        }
        bVar2 = inCheck(bVar2,in_stack_fffffffffffffc68);
        mVar4 = arrayMoveList::getMove(&local_330);
        bVar5 = mVar4.end;
        if (bVar5 < 0x3a) {
          if (bVar5 == 2) {
            mVar4 = arrayMoveList::getMove(&local_330);
            mVar4 = (move)((uint3)mVar4 & 0xff | 0x300);
            goto LAB_00103d9f;
          }
          if (bVar5 == 6) {
            mVar4 = arrayMoveList::getMove(&local_330);
            mVar4 = (move)((uint3)mVar4 & 0xff | 0x500);
            goto LAB_00103d9f;
          }
LAB_00103d74:
          if (!bVar1 || bVar2) goto LAB_00103dd1;
        }
        else {
          if (bVar5 == 0x3a) {
            mVar4 = arrayMoveList::getMove(&local_330);
            mVar4 = (move)((uint3)mVar4 & 0xff | 0x3b00);
          }
          else {
            if (bVar5 != 0x3e) goto LAB_00103d74;
            mVar4 = arrayMoveList::getMove(&local_330);
            mVar4 = (move)((uint3)mVar4 & 0xff | 0x3d00);
          }
LAB_00103d9f:
          makeMove(this,mVar4);
          bVar3 = isGameLegal(this);
          undoMove(this);
          if ((!bVar1 || bVar2) || !bVar3) goto LAB_00103dd1;
        }
        mVar4 = arrayMoveList::getMove(&local_330);
        arrayMoveList::add(__return_storage_ptr__,mVar4);
      }
      else {
        if (bVar1) {
          mVar4 = arrayMoveList::getMove(&local_330);
          arrayMoveList::add(__return_storage_ptr__,mVar4);
        }
        undoMove(this);
      }
LAB_00103dd1:
      bVar1 = arrayMoveList::next(&local_330);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

arrayMoveList game::generateLegalMoves() {
    arrayMoveList moves = generateSemilegalMoves();
    arrayMoveList returnedMoves;

    moves.resetIterator();
    while(moves.next()) {
        if(moves.getMove().special == 1) { // Are castling kings put in check en route?
            bool good = true;
            makeMove(moves.getMove());
            if(!isGameLegal()) good = false;
            undoMove();

            if(inCheck(blacksTurn, boards)) good = false;

            move intermediate;
            switch (moves.getMove().end) {
                case 2:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 3;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 6:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 5;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 58:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 59;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
                case 62:
                    intermediate.start = moves.getMove().start;
                    intermediate.end = 61;
                    makeMove(intermediate);
                    if(!isGameLegal()) good = false;
                    undoMove();
                    break;
            }
            if(good) returnedMoves.add(moves.getMove());
        } else {
            makeMove(moves.getMove());
            if(isGameLegal()) returnedMoves.add(moves.getMove());
            undoMove();
        }
    }
    return returnedMoves;
}